

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_state.hpp
# Opt level: O2

void __thiscall
duckdb::WindowQuantileState<duckdb::dtime_t>::SkipListUpdater::Right
          (SkipListUpdater *this,idx_t begin,idx_t end)

{
  HeadNode<std::pair<unsigned_long,_duckdb::dtime_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::dtime_t>_>_>
  *this_00;
  bool bVar1;
  dtime_t *pdVar2;
  idx_t local_40;
  pair<unsigned_long,_duckdb::dtime_t> local_38;
  
  while (begin < end) {
    local_40 = begin;
    bVar1 = QuantileIncluded<duckdb::dtime_t>::operator()(this->included,&local_40);
    if (bVar1) {
      this_00 = this->skip;
      pdVar2 = QuantileCursor<duckdb::dtime_t>::operator[](this->data,local_40);
      local_38.first = local_40;
      local_38.second.micros = pdVar2->micros;
      duckdb_skiplistlib::skip_list::
      HeadNode<std::pair<unsigned_long,_duckdb::dtime_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::dtime_t>_>_>
      ::insert(this_00,&local_38);
    }
    begin = local_40 + 1;
  }
  return;
}

Assistant:

inline void Right(idx_t begin, idx_t end) {
			for (; begin < end; ++begin) {
				if (included(begin)) {
					skip.insert(SkipType(begin, data[begin]));
				}
			}
		}